

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_list.h
# Opt level: O2

void __thiscall spvtools::opt::InstructionList::clear(InstructionList *this)

{
  Instruction *pIVar1;
  
  while ((pIVar1 = (this->super_IntrusiveList<spvtools::opt::Instruction>).sentinel_.
                   super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_,
         pIVar1 != (Instruction *)0x0 &&
         ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false))) {
    pIVar1 = utils::IntrusiveList<spvtools::opt::Instruction>::front
                       (&this->super_IntrusiveList<spvtools::opt::Instruction>);
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList
              (&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
    (*(pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])
              (pIVar1);
  }
  return;
}

Assistant:

void InstructionList::clear() {
  while (!empty()) {
    Instruction* inst = &front();
    inst->RemoveFromList();
    delete inst;
  }
}